

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

HairMaterial * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::HairMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
          (polymorphic_allocator<std::byte> *this,SpectrumTextureHandle *args,
          SpectrumTextureHandle *args_1,FloatTextureHandle *args_2,FloatTextureHandle *args_3,
          FloatTextureHandle *args_4,FloatTextureHandle *args_5,FloatTextureHandle *args_6,
          FloatTextureHandle *args_7)

{
  HairMaterial *pHVar1;
  FloatTextureHandle *unaff_RBX;
  FloatTextureHandle *unaff_retaddr;
  SpectrumTextureHandle *in_stack_00000008;
  SpectrumTextureHandle *in_stack_00000010;
  HairMaterial *in_stack_00000018;
  polymorphic_allocator<std::byte> *in_stack_00000020;
  HairMaterial *p;
  size_t in_stack_ffffffffffffff98;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffa0;
  
  pHVar1 = allocate_object<pbrt::HairMaterial>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  construct<pbrt::HairMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             unaff_RBX,args_4,args_3,args_2,(FloatTextureHandle *)args_1);
  return pHVar1;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }